

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Variable * __thiscall
soul::BlockBuilder::createMutableLocalVariable(BlockBuilder *this,Type *type,string *name)

{
  Variable *pVVar1;
  Identifier local_30;
  Type local_28;
  
  local_28.category = type->category;
  local_28.arrayElementCategory = type->arrayElementCategory;
  local_28.isRef = type->isRef;
  local_28.isConstant = type->isConstant;
  local_28.primitiveType.type = (type->primitiveType).type;
  local_28.boundingSize = type->boundingSize;
  local_28.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_28.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_30 = createIdentifier<std::__cxx11::string>(this,name);
  pVVar1 = createVariable<soul::Identifier>(this,&local_28,&local_30,mutableLocal);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
  return pVVar1;
}

Assistant:

heart::Variable& createMutableLocalVariable (Type type, std::string name)
    {
        return createVariable (std::move (type), createIdentifier (std::move (name)), heart::Variable::Role::mutableLocal);
    }